

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.cpp
# Opt level: O2

vector<duckdb_re2::Match,_true> *
duckdb_re2::RegexFindAll
          (vector<duckdb_re2::Match,_true> *__return_storage_ptr__,char *input_data,
          size_t input_size,RE2 *regex)

{
  byte bVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  InvalidInputException *this;
  size_t start;
  Match match;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super_vector<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>).
  super__Vector_base<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>).
  super__Vector_base<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>).
  super__Vector_base<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  match.groups.super_vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>.
  super__Vector_base<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  match.groups.super_vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>.
  super__Vector_base<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  match.groups.super_vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>.
  super__Vector_base<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  start = 0;
  do {
    bVar2 = RegexSearchInternal(input_data,input_size,&match,regex,UNANCHORED,start,input_size);
    if (!bVar2) {
LAB_00331f74:
      duckdb::std::vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>::~vector
                ((vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_> *)&match);
      return __return_storage_ptr__;
    }
    uVar3 = Match::length(&match,0);
    if (uVar3 == 0) {
      uVar3 = Match::position(&match,0);
      bVar1 = input_data[uVar3];
      uVar3 = 1;
      if ((char)bVar1 < '\0') {
        uVar3 = 2;
        if ((bVar1 & 0xe0) != 0xc0) {
          uVar3 = 3;
          if ((bVar1 & 0xf0) != 0xe0) {
            uVar3 = 4;
            if ((bVar1 & 0xf8) != 0xf0) {
              this = (InvalidInputException *)__cxa_allocate_exception(0x10);
              uVar3 = Match::position(&match,0);
              std::__cxx11::to_string(&local_70,uVar3 + 1);
              std::operator+(&local_50,"Invalid UTF-8 leading byte at position ",&local_70);
              duckdb::InvalidInputException::InvalidInputException(this,&local_50);
              __cxa_throw(this,&duckdb::InvalidInputException::typeinfo,
                          std::runtime_error::~runtime_error);
            }
          }
        }
      }
      uVar4 = Match::position(&match,0);
      if (input_size <= uVar4 + uVar3) {
        std::vector<duckdb_re2::Match,std::allocator<duckdb_re2::Match>>::
        emplace_back<duckdb_re2::Match&>
                  ((vector<duckdb_re2::Match,std::allocator<duckdb_re2::Match>> *)
                   __return_storage_ptr__,&match);
        goto LAB_00331f74;
      }
      uVar4 = Match::position(&match,0);
    }
    else {
      uVar3 = Match::position(&match,0);
      uVar4 = Match::length(&match,0);
    }
    start = uVar4 + uVar3;
    std::vector<duckdb_re2::Match,std::allocator<duckdb_re2::Match>>::
    emplace_back<duckdb_re2::Match&>
              ((vector<duckdb_re2::Match,std::allocator<duckdb_re2::Match>> *)__return_storage_ptr__
               ,&match);
  } while( true );
}

Assistant:

duckdb::vector<Match> RegexFindAll(const char *input_data, size_t input_size, const RE2 &regex) {
	duckdb::vector<Match> matches;
	size_t position = 0;
	Match match;
	while (RegexSearchInternal(input_data, input_size, match, regex, RE2::UNANCHORED, position, input_size)) {
		if (match.length(0)) {
			position = match.position(0) + match.length(0);
		} else { // match.length(0) == 0
			auto next_char_length = GetMultibyteCharLength(input_data[match.position(0)]);
			if (!next_char_length) {
				throw duckdb::InvalidInputException("Invalid UTF-8 leading byte at position " +
				                                    std::to_string(match.position(0) + 1));
			}
			if (match.position(0) + next_char_length < input_size) {
				position = match.position(0) + next_char_length;
			} else {
				matches.emplace_back(match);
				break;
			}
		}
		matches.emplace_back(match);
	}
	return matches;
}